

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O1

void __thiscall FR<8U>::Init(FR<8U> *this,Data<8U> *data)

{
  int *piVar1;
  byte bVar2;
  uchar *puVar3;
  Counter *pCVar4;
  ulong uVar5;
  uint position;
  uint uVar6;
  int i;
  uint uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  uVar7 = 0;
  bVar9 = true;
  do {
    uVar6 = Data<8U>::Hash(data,uVar7);
    uVar5 = (ulong)uVar6 % (ulong)(uint)this->LENGTH;
    puVar3 = this->bitset->bitset;
    bVar2 = puVar3[uVar5 >> 3];
    if ((bVar2 >> ((uint)uVar5 & 7) & 1) == 0) {
      puVar3[uVar5 >> 3] = (byte)(1 << ((byte)uVar5 & 7)) | bVar2;
      bVar9 = false;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 3);
  uVar7 = 0;
  do {
    uVar6 = Data<8U>::Hash(data,uVar7);
    uVar5 = (ulong)uVar6 % (ulong)(uint)this->SIZE;
    if (!bVar9) {
      this->flow = this->flow + 1;
      pCVar4 = this->counter;
      lVar8 = 0;
      do {
        puVar3 = pCVar4[uVar5].data.str + lVar8;
        *puVar3 = *puVar3 ^ data->str[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      piVar1 = &this->counter[uVar5].count;
      *piVar1 = *piVar1 + 1;
    }
    piVar1 = &this->counter[uVar5].packet;
    *piVar1 = *piVar1 + 1;
    bVar10 = uVar7 == 0;
    uVar7 = uVar7 + 1;
  } while (bVar10);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& data) {
		bool init = true;
		for (int i = 0; i < 3; ++i) {
			uint position = data.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		for (int i = 0; i < 2; ++i) {
			uint position = data.Hash(i) % SIZE;
			if (!init) {
				flow++;
				counter[position].data ^= data;
				counter[position].count += 1;
			}
			counter[position].packet += 1;
		}
	}